

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS
ref_search_gather_tri
          (REF_SEARCH ref_search,REF_DBL *xyz,REF_INT parent,REF_DBL *position,REF_DBL *distance)

{
  uint uVar1;
  REF_STATUS RVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  double dVar8;
  double dVar9;
  REF_DBL element_dist;
  
  RVar2 = 0;
  if (parent != -1 && ref_search->n != 0) {
    if (parent < 0 || ref_search->n <= parent) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x118,"ref_search_gather_tri","parent invalid");
      printf("%d n %d parent\n",(ulong)(uint)ref_search->n,(ulong)(uint)parent);
      RVar2 = 1;
    }
    else if (ref_search->item[(uint)parent] != -1) {
      uVar1 = ref_search->d;
      uVar5 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar5;
      }
      dVar8 = 0.0;
      for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        dVar9 = position[uVar5] - ref_search->pos[(long)(int)(parent * uVar1) + uVar5];
        dVar8 = dVar8 + dVar9 * dVar9;
      }
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar9 = *distance;
      if (dVar8 - ref_search->radius[(uint)parent] <= dVar9) {
        lVar4 = (long)ref_search->item[(uint)parent];
        ref_search_distance3
                  (xyz + lVar4 * 9,xyz + lVar4 * 9 + 3,xyz + lVar4 * 9 + 6,position,&element_dist);
        if (element_dist <= dVar9) {
          dVar9 = element_dist;
        }
        *distance = dVar9;
      }
      RVar2 = 0;
      if (dVar8 - ref_search->children_ball[(uint)parent] <= dVar9) {
        RVar2 = ref_search_gather_tri
                          (ref_search,xyz,ref_search->left[(uint)parent],position,distance);
        if (RVar2 == 0) {
          RVar2 = ref_search_gather_tri
                            (ref_search,xyz,ref_search->right[(uint)parent],position,distance);
          if (RVar2 == 0) {
            return 0;
          }
          pcVar7 = "gthr right";
          uVar6 = 0x133;
        }
        else {
          pcVar7 = "gthr left";
          uVar6 = 0x130;
        }
        RVar2 = 1;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               uVar6,"ref_search_gather_tri",1,pcVar7);
      }
    }
  }
  return RVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_search_gather_tri(REF_SEARCH ref_search,
                                                REF_DBL *xyz, REF_INT parent,
                                                REF_DBL *position,
                                                REF_DBL *distance) {
  REF_INT i;
  REF_DBL dist;

  if (0 == ref_search->n) return REF_SUCCESS;  /* tree empty */
  if (REF_EMPTY == parent) return REF_SUCCESS; /* finished traversing */
  RAB(0 <= parent && parent < ref_search->n, "parent invalid",
      { printf("%d n %d parent\n", ref_search->n, parent); });
  /* finished traversing */
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  dist = 0.0;
  for (i = 0; i < ref_search->d; i++)
    dist += pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  dist = sqrt(dist);

  /* if the distance between me and the target are less than combined radii */
  if (dist - ref_search->radius[parent] <= *distance) {
    REF_INT element = ref_search->item[parent];
    REF_DBL element_dist;
    RSS(ref_search_distance3(&(xyz[0 + 9 * element]), &(xyz[3 + 9 * element]),
                             &(xyz[6 + 9 * element]), position, &element_dist),
        "tri dist");
    *distance = MIN(*distance, element_dist);
  }

  /* if the distance between me and the target are less than children
   * children_ball includes child radii, so only subtract target radius */
  if (*distance >= dist - ref_search->children_ball[parent]) {
    RSS(ref_search_gather_tri(ref_search, xyz, ref_search->left[parent],
                              position, distance),
        "gthr left");
    RSS(ref_search_gather_tri(ref_search, xyz, ref_search->right[parent],
                              position, distance),
        "gthr right");
  }

  return REF_SUCCESS;
}